

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_engine.h
# Opt level: O3

bool __thiscall
BamTools::FilterEngine<BamTools::BamAlignmentChecker>::addProperty
          (FilterEngine<BamTools::BamAlignmentChecker> *this,string *propertyName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pPVar3;
  pointer pPVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propertyNames;
  Property local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  allPropertyNames_abi_cxx11_(&local_38,this);
  bVar6 = std::
          binary_search<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_38.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_38.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,propertyName);
  if (!bVar6) {
    paVar1 = &local_60.Name.field_2;
    pcVar2 = (propertyName->_M_dataplus)._M_p;
    local_60.Name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + propertyName->_M_string_length);
    local_60.IsEnabled = false;
    std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::
    emplace_back<BamTools::Property>(&this->m_properties,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.Name._M_dataplus._M_p);
    }
    pPVar3 = (this->m_properties).
             super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar4 = (this->m_properties).
             super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar3 != pPVar4) {
      uVar7 = ((long)pPVar4 - (long)pPVar3 >> 3) * -0x3333333333333333;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pPVar3,pPVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pPVar3,pPVar4);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return !bVar6;
}

Assistant:

bool FilterEngine<FilterChecker>::addProperty(const std::string& propertyName)
{
    const std::vector<std::string> propertyNames = allPropertyNames();
    bool found = std::binary_search(propertyNames.begin(), propertyNames.end(), propertyName);
    if (found) {
        return false;
    }
    m_properties.push_back(Property(propertyName));
    std::sort(m_properties.begin(), m_properties.end());
    return true;
}